

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrack.cc
# Opt level: O0

void __thiscall re2::Backtracker::Backtracker(Backtracker *this,Prog *prog)

{
  Prog *prog_local;
  Backtracker *this_local;
  
  this->prog_ = prog;
  StringPiece::StringPiece(&this->text_);
  StringPiece::StringPiece(&this->context_);
  this->anchored_ = false;
  this->longest_ = false;
  this->endmatch_ = false;
  this->submatch_ = (StringPiece *)0x0;
  this->nsubmatch_ = 0;
  this->visited_ = (uint32 *)0x0;
  this->nvisited_ = 0;
  return;
}

Assistant:

Backtracker::Backtracker(Prog* prog)
  : prog_(prog),
    anchored_(false),
    longest_(false),
    endmatch_(false),
    submatch_(NULL),
    nsubmatch_(0),
    visited_(NULL),
    nvisited_(0) {
}